

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
          (MultiPartOutputFile *this,OStream *os,Header *headers,int parts,
          bool overrideSharedAttributes,int numThreads)

{
  Data *this_00;
  size_type sVar1;
  reference headers_00;
  int in_ECX;
  _func_int *in_RSI;
  GenericOutputFile *in_RDI;
  bool in_stack_0000006f;
  Data *in_stack_00000070;
  stringstream _iex_replace_s;
  BaseExc *e;
  size_t i_1;
  int i;
  value_type *in_stack_fffffffffffffda8;
  int parts_00;
  Data *in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  Header *in_stack_fffffffffffffdc0;
  OutputStreamMutex *in_stack_fffffffffffffdc8;
  Data *in_stack_fffffffffffffdd0;
  Header *in_stack_fffffffffffffdd8;
  Header *in_stack_fffffffffffffde0;
  vector<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_> *parts_01;
  ulong local_40;
  int local_38;
  
  GenericOutputFile::GenericOutputFile(in_RDI);
  in_RDI->_vptr_GenericOutputFile = (_func_int **)&PTR__MultiPartOutputFile_002acd10;
  parts_01 = (vector<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_> *)
             (in_RDI + 1);
  this_00 = (Data *)operator_new(0xa0);
  Data::Data(in_stack_fffffffffffffdb0,SUB81((ulong)in_stack_fffffffffffffda8 >> 0x38,0),
             (int)in_stack_fffffffffffffda8);
  (parts_01->
  super__Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)this_00;
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::resize
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)in_stack_fffffffffffffdd0,
             (size_type)in_stack_fffffffffffffdc8);
  in_RDI[1]._vptr_GenericOutputFile[5] = in_RSI;
  for (local_38 = 0; local_38 < in_ECX; local_38 = local_38 + 1) {
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (in_RDI[1]._vptr_GenericOutputFile + 0x11),(long)local_38);
    Header::operator=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  }
  Data::do_header_sanity_checks(in_stack_00000070,in_stack_0000006f);
  local_40 = 0;
  while( true ) {
    sVar1 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size
                      ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                       (in_RDI[1]._vptr_GenericOutputFile + 0x11));
    if (sVar1 <= local_40) break;
    operator_new(0x60);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (in_RDI[1]._vptr_GenericOutputFile + 0x11),local_40);
    OutputPartData::OutputPartData
              ((OutputPartData *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
               in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8,
               SUB81((ulong)in_stack_fffffffffffffdb0 >> 0x38,0));
    std::vector<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>::push_back
              ((vector<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_> *)
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    local_40 = local_40 + 1;
  }
  parts_00 = (int)((ulong)in_RDI[1]._vptr_GenericOutputFile[5] >> 0x20);
  headers_00 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                         ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                          (in_RDI[1]._vptr_GenericOutputFile + 0x11),0);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
             (in_RDI[1]._vptr_GenericOutputFile + 0x11));
  GenericOutputFile::writeMagicNumberAndVersionField
            ((GenericOutputFile *)in_stack_fffffffffffffdc0,
             (OStream *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),headers_00,
             parts_00);
  Data::writeHeadersToFile
            (in_stack_fffffffffffffdd0,
             (vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)in_stack_fffffffffffffdc8)
  ;
  Data::writeChunkTableOffsets(this_00,parts_01);
  return;
}

Assistant:

MultiPartOutputFile::MultiPartOutputFile (
    OStream&      os,
    const Header* headers,
    int           parts,
    bool          overrideSharedAttributes,
    int           numThreads)
    : _data (new Data (false, numThreads))
{
    // grab headers
    _data->_headers.resize (parts);
    _data->os = &os;

    for (int i = 0; i < parts; i++)
    {
        _data->_headers[i] = headers[i];
    }
    try
    {

        _data->do_header_sanity_checks (overrideSharedAttributes);

        //
        // Build parts and write headers and offset tables to file.
        //

        for (size_t i = 0; i < _data->_headers.size (); i++)
            _data->parts.push_back (new OutputPartData (
                _data, _data->_headers[i], i, numThreads, parts > 1));

        writeMagicNumberAndVersionField (
            *_data->os, &_data->_headers[0], _data->_headers.size ());
        _data->writeHeadersToFile (_data->_headers);
        _data->writeChunkTableOffsets (_data->parts);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        delete _data;

        REPLACE_EXC (
            e,
            "Cannot open image stream "
            "\"" << os.fileName ()
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        delete _data;
        throw;
    }
}